

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O2

stbi_uc * stbi_load_from_memory(stbi_uc *buffer,int len,int *x,int *y,int *comp,int req_comp)

{
  int iVar1;
  stbi_uc *psVar2;
  float *data;
  long lVar3;
  
  iVar1 = stbi_jpeg_test_memory(buffer,len);
  if (iVar1 != 0) {
    psVar2 = stbi_jpeg_load_from_memory(buffer,len,x,y,comp,req_comp);
    return psVar2;
  }
  iVar1 = stbi_png_test_memory(buffer,len);
  if (iVar1 != 0) {
    psVar2 = stbi_png_load_from_memory(buffer,len,x,y,comp,req_comp);
    return psVar2;
  }
  iVar1 = stbi_bmp_test_memory(buffer,len);
  if (iVar1 != 0) {
    psVar2 = stbi_bmp_load_from_memory(buffer,len,x,y,comp,req_comp);
    return psVar2;
  }
  iVar1 = stbi_psd_test_memory(buffer,len);
  if (iVar1 != 0) {
    psVar2 = stbi_psd_load_from_memory(buffer,len,x,y,comp,req_comp);
    return psVar2;
  }
  iVar1 = stbi_dds_test_memory(buffer,len);
  if (iVar1 != 0) {
    psVar2 = stbi_dds_load_from_memory(buffer,len,x,y,comp,req_comp);
    return psVar2;
  }
  iVar1 = stbi_hdr_test_memory(buffer,len);
  if (iVar1 != 0) {
    data = stbi_hdr_load_from_memory(buffer,len,x,y,comp,req_comp);
    if (req_comp == 0) {
      req_comp = *comp;
    }
    psVar2 = hdr_to_ldr(data,*x,*y,req_comp);
    return psVar2;
  }
  lVar3 = 0;
  do {
    if (max_loaders <= lVar3) {
      iVar1 = stbi_tga_test_memory(buffer,len);
      if (iVar1 != 0) {
        psVar2 = stbi_tga_load_from_memory(buffer,len,x,y,comp,req_comp);
        return psVar2;
      }
      failure_reason = "Image not of any known type, or corrupt";
      return (stbi_uc *)0x0;
    }
    iVar1 = (*loaders[lVar3]->test_memory)(buffer,len);
    lVar3 = lVar3 + 1;
  } while (iVar1 == 0);
  psVar2 = (stbi_uc *)
           (**(code **)(*(long *)(&DAT_001b88a8 + lVar3 * 8) + 8))(buffer,len,x,y,comp,req_comp);
  return psVar2;
}

Assistant:

unsigned char *stbi_load_from_memory(stbi_uc const *buffer, int len, int *x, int *y, int *comp, int req_comp)
{
   int i;
   if (stbi_jpeg_test_memory(buffer,len))
      return stbi_jpeg_load_from_memory(buffer,len,x,y,comp,req_comp);
   if (stbi_png_test_memory(buffer,len))
      return stbi_png_load_from_memory(buffer,len,x,y,comp,req_comp);
   if (stbi_bmp_test_memory(buffer,len))
      return stbi_bmp_load_from_memory(buffer,len,x,y,comp,req_comp);
   if (stbi_psd_test_memory(buffer,len))
      return stbi_psd_load_from_memory(buffer,len,x,y,comp,req_comp);
   #ifndef STBI_NO_DDS
   if (stbi_dds_test_memory(buffer,len))
      return stbi_dds_load_from_memory(buffer,len,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_HDR
   if (stbi_hdr_test_memory(buffer, len)) {
      float *hdr = stbi_hdr_load_from_memory(buffer, len,x,y,comp,req_comp);
      return hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif
   for (i=0; i < max_loaders; ++i)
      if (loaders[i]->test_memory(buffer,len))
         return loaders[i]->load_from_memory(buffer,len,x,y,comp,req_comp);
   // test tga last because it's a crappy test!
   if (stbi_tga_test_memory(buffer,len))
      return stbi_tga_load_from_memory(buffer,len,x,y,comp,req_comp);
   return epuc("unknown image type", "Image not of any known type, or corrupt");
}